

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoney.cpp
# Opt level: O3

void __thiscall OrderMoney::OrderMoney(OrderMoney *this,shared_ptr<const_Money> *a)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *peVar3;
  undefined1 local_4d;
  int local_4c;
  RealMoney *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (this->super_Money)._vptr_Money = (_func_int **)&PTR__OrderMoney_001202e8;
  peVar3 = (a->super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->a).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  p_Var1 = (a->super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->a).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      peVar3 = (a->super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_4c = 0;
  (*peVar3->_vptr_Money[3])(&local_30);
  local_48 = (RealMoney *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RealMoney,std::allocator<RealMoney>,int,std::__cxx11::string>
            (a_Stack_40,&local_48,(allocator<RealMoney> *)&local_4d,&local_4c,&local_30);
  _Var2._M_pi = a_Stack_40[0]._M_pi;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->b).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_48->super_Money;
  (this->b).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  local_48 = (RealMoney *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

OrderMoney::OrderMoney(const shared_ptr<const Money> &a)
	: a(a), b(make_shared<RealMoney>(0, a->currency()))
{
}